

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_check_crc(uchar *chunk)

{
  uint uVar1;
  uint uVar2;
  long in_RDI;
  uint checksum;
  uint CRC;
  uint length;
  uint local_4;
  
  uVar1 = lodepng_chunk_length((uchar *)0x118ef3);
  uVar2 = lodepng_read32bitInt((uchar *)(in_RDI + (ulong)(uVar1 + 8)));
  uVar1 = lodepng_crc32((uchar *)(in_RDI + 4),(ulong)(uVar1 + 4));
  local_4 = (uint)(uVar2 != uVar1);
  return local_4;
}

Assistant:

unsigned lodepng_chunk_check_crc(const unsigned char* chunk)
{
	unsigned length = lodepng_chunk_length(chunk);
	unsigned CRC = lodepng_read32bitInt(&chunk[length + 8]);
	/*the CRC is taken of the data and the 4 chunk type letters, not the length*/
	unsigned checksum = lodepng_crc32(&chunk[4], length + 4);
	if (CRC != checksum) return 1;
	else return 0;
}